

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

bool IsOperaSoftTrack(Track *track)

{
  int iVar1;
  Sector *s;
  pointer pSVar2;
  uint uVar3;
  bool bVar4;
  uint8_t *puVar5;
  Track *__range1;
  
  iVar1 = Track::size(track);
  uVar3 = 0;
  bVar4 = false;
  if (iVar1 == 9) {
    puVar5 = "\x01\x01\x01\x01\x01\x01\x01\x01\b";
    for (pSVar2 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar2 != (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
      if (pSVar2->datarate != _250K) {
        return false;
      }
      if (pSVar2->encoding != MFM) {
        return false;
      }
      if ((pSVar2->header).size != (uint)*puVar5) goto LAB_00175303;
      uVar3 = uVar3 | 1 << ((byte)(pSVar2->header).sector & 0x1f);
      puVar5 = puVar5 + 1;
    }
    if (uVar3 == 0x1ff) {
      bVar4 = true;
      if (opt.debug != 0) {
        util::operator<<((LogHelper *)&util::cout,
                         (char (*) [42])"detected OperaSoft track with 32K sector\n");
      }
    }
    else {
LAB_00175303:
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool IsOperaSoftTrack(const Track& track)
{
    uint32_t sector_mask = 0;
    int i = 0;

    if (track.size() != 9)
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM)
            return false;

        static const uint8_t sizes[] = { 1,1,1,1,1,1,1,1,8 };
        if (s.header.size != sizes[i++])
            return false;

        sector_mask |= (1 << s.header.sector);
    }

    // Sectors must be numbered 0 to 8
    if (sector_mask != ((1 << 9) - 1))
        return false;

    if (opt.debug) util::cout << "detected OperaSoft track with 32K sector\n";
    return true;
}